

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_sync.cpp
# Opt level: O1

int main(void)

{
  Logger *this;
  long lVar1;
  int iVar2;
  long lVar3;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  this = Logger::get_instance();
  Logger::init(this,(EVP_PKEY_CTX *)"./log_sync.txt");
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] sync log test started\n","info","main",0x1f);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] start to log\n","info","main",0x20);
  }
  iVar2 = 5;
  lVar1 = std::chrono::_V2::steady_clock::now();
  do {
    std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
              ((vector<std::thread,std::allocator<std::thread>> *)&local_48,log_sync_test);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  lVar3 = 0;
  do {
    std::thread::join();
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x28);
  lVar3 = std::chrono::_V2::steady_clock::now();
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] end logging\n","info","main",0x2e);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] totally write %d items into files\n","info","main",0x2f,55000);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] costed time: %d ms\n","info","main",0x30,
           (lVar3 - lVar1) / 1000000 & 0xffffffff);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  return 0;
}

Assistant:

int main()
{

    Logger::get_instance()->init("./log_sync.txt");

    vector<thread> threads;
    
    PR_INFO("sync log test started\n");
    PR_INFO("start to log\n");
    auto start = chrono::steady_clock::now();

    for(int i=0; i<g_t_num; i++)
    {
        threads.emplace_back(log_sync_test);       
    }
    for(int i=0; i<g_t_num; i++)
    {
        threads[i].join();   
    }

    auto end = chrono::steady_clock::now();
    auto duration = chrono::duration_cast<chrono::milliseconds>(end - start);
    PR_INFO("end logging\n"); 
    PR_INFO("totally write %d items into files\n", g_t_num * g_item_num);
    PR_INFO("costed time: %d ms\n" ,static_cast<int>(duration.count()));
    return 0;
}